

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::validForwardSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int *newSol1,int *newSol2,int *worseSol)

{
  int iVar1;
  pointer piVar2;
  pointer pMVar3;
  pointer pFVar4;
  bool bVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  void *__ptr;
  undefined8 *puVar11;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *val;
  double *pdVar12;
  char *pmessage;
  X *pXVar13;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  longdouble *in_R9;
  Scal *pSVar14;
  long lVar15;
  Index othersize;
  long lVar16;
  long lVar17;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  Vec T;
  Vec sumWsq;
  undefined1 local_d1;
  double local_d0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_c8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_b8;
  longdouble local_9c;
  double local_90;
  longdouble local_84;
  int *local_78;
  int *local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  longdouble local_3c;
  
  if ((long)this->M < 1) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc((long)this->M << 3);
    if (__ptr == (void *)0x0) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = operator_delete;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  lVar16 = (long)this->nSolFound;
  local_c8.m_storage.m_data = (double *)0x0;
  local_c8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_c8,lVar16,1);
  if (local_c8.m_storage.m_rows != lVar16) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_c8,lVar16,1);
  }
  if (0 < local_c8.m_storage.m_rows) {
    memset(local_c8.m_storage.m_data,0,local_c8.m_storage.m_rows << 3);
  }
  lVar16 = (long)this->nSolFound;
  local_b8.m_storage.m_data = (double *)0x0;
  local_b8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_b8,lVar16,1);
  if (local_b8.m_storage.m_rows != lVar16) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_b8,lVar16,1);
  }
  if (0 < local_b8.m_storage.m_rows) {
    memset(local_b8.m_storage.m_data,0,local_b8.m_storage.m_rows << 3);
  }
  iVar1 = this->M;
  if (0 < (long)iVar1) {
    piVar2 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar12 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    pMVar3 = (this->predictions).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar16 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    pSVar14 = &(((this->experts).
                 super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 .
                 super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert<1,_1>).p_z_T;
    lVar15 = 0;
    do {
      lVar17 = (long)piVar2[lVar15];
      dVar19 = (double)(((X *)(pSVar14 + 6))->
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage -
               (double)pMVar3[lVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                       m_storage;
      dVar19 = *pdVar12 * dVar19 * dVar19;
      *(double *)((long)__ptr + lVar15 * 8) = dVar19;
      *(double *)((long)local_c8.m_storage.m_data + lVar17 * 8) =
           dVar19 + *(double *)((long)local_c8.m_storage.m_data + lVar17 * 8);
      *(double *)((long)local_b8.m_storage.m_data + lVar17 * 8) =
           *pSVar14 * *pSVar14 + *(double *)((long)local_b8.m_storage.m_data + lVar17 * 8);
      lVar15 = lVar15 + 1;
      pSVar14 = pSVar14 + 0x35;
      pdVar12 = pdVar12 + lVar16;
      in_R8 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
               *)local_c8.m_storage.m_data;
      in_R9 = (longdouble *)local_b8.m_storage.m_data;
    } while (iVar1 != lVar15);
  }
  *worseSol = -1;
  local_78 = newSol1;
  local_70 = newSol2;
  if (this->nSolFound < 1) {
    local_d0 = -1.0;
  }
  else {
    lVar15 = 0;
    local_84 = (longdouble)1.79769313486232e+308;
    lVar16 = 0;
    local_d0 = -1.0;
    do {
      dVar19 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar16];
      dVar19 = (dVar19 * dVar19) / *(double *)((long)local_b8.m_storage.m_data + lVar16 * 8) + -1.0
               + 1.0;
      if ((1.0 <= dVar19) && (0.0 < *(double *)((long)local_c8.m_storage.m_data + lVar16 * 8))) {
        local_90 = dVar19;
        if (0x3fe < (uint)((ulong)((long)ABS(dVar19) + -0x10000000000000) >> 0x35) ||
            (long)dVar19 < 0) {
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
                     "Degrees of freedom argument is %1%, but must be > 0 !",&local_90);
        }
        local_48 = local_90;
        pmessage = "Degrees of freedom argument is %1%, but must be > 0 !";
        val = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
               *)&local_48;
        if ((long)local_90 - 1U < 0xfffffffffffff ||
            -1 < (long)local_90 && (uint)((long)ABS(local_90) + 0xfff0000000000000U >> 0x35) < 0x3ff
           ) {
          dVar19 = *(double *)((long)local_c8.m_storage.m_data + lVar15);
          if ((0x3fe < (uint)((ulong)((long)ABS(dVar19) + -0x10000000000000) >> 0x35) ||
              (long)dVar19 < 0) && (ABS(dVar19) != 0.0 && 0xffffffffffffe < (long)dVar19 - 1U)) {
            val = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                   *)((long)local_c8.m_storage.m_data + lVar15);
            pmessage = "Chi Square parameter was %1%, but must be > 0 !";
            goto LAB_0014c670;
          }
          local_50 = local_90 * 0.5;
          local_58 = dVar19 * 0.5;
          boost::math::detail::
          gamma_incomplete_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((longdouble *)0x1,(detail *)0x0,(longdouble)local_50,(longdouble)local_58,
                     SUB81(&local_d1,0),false,in_R8,in_R9);
          local_3c = ABS(in_ST0);
          dVar19 = 0.0;
          lVar6 = in_ST1;
          lVar7 = in_ST2;
          lVar8 = in_ST3;
          lVar9 = in_ST4;
          lVar10 = in_ST5;
          local_9c = in_ST0;
          if (local_84 < local_3c) {
            lVar18 = in_ST5;
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("gamma_p<%1%>(%1%, %1%)","numeric overflow");
            dVar19 = (double)local_9c;
            lVar6 = in_ST1;
            lVar7 = in_ST2;
            lVar8 = in_ST3;
            lVar9 = in_ST4;
            lVar10 = in_ST5;
            in_ST5 = lVar18;
            local_60 = dVar19;
          }
          in_ST4 = lVar10;
          in_ST3 = lVar9;
          in_ST2 = lVar8;
          in_ST1 = lVar7;
          in_ST0 = lVar6;
          local_68 = (double)local_9c;
          if (local_3c <= local_84) {
            dVar19 = local_68;
          }
        }
        else {
LAB_0014c670:
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    (boost::math::
                     cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
                     ::function,pmessage,(double *)val);
          dVar19 = NAN;
        }
        if (local_d0 <= dVar19) {
          *worseSol = (int)lVar16;
          local_d0 = dVar19;
        }
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 8;
    } while (lVar16 < this->nSolFound);
  }
  dVar19 = (this->param).multiValuedSignificance;
  if (dVar19 < local_d0) {
    if (0 < this->M) {
      piVar2 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar20 = -1.0;
      lVar16 = 0;
      do {
        if ((piVar2[lVar16] == *worseSol) &&
           (dVar21 = *(double *)((long)__ptr + lVar16 * 8), dVar20 < dVar21)) {
          *local_78 = (int)lVar16;
          dVar20 = dVar21;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < this->M);
    }
    if (0 < this->M) {
      pFVar4 = (this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar2 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar12 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar16 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pXVar13 = &(pFVar4->super_LinearExpert<1,_1>).pred_x;
      dVar20 = -1.0;
      lVar15 = 0;
      do {
        if ((piVar2[lVar15] == *worseSol) &&
           (dVar21 = (double)(pXVar13->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
                             .m_storage -
                     (double)pFVar4[*local_78].super_LinearExpert<1,_1>.pred_x.
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage,
           dVar21 = *pdVar12 * dVar21 * dVar21, dVar20 < dVar21)) {
          *local_70 = (int)lVar15;
          dVar20 = dVar21;
        }
        lVar15 = lVar15 + 1;
        pdVar12 = pdVar12 + lVar16;
        pXVar13 = pXVar13 + 0x35;
      } while (lVar15 < this->M);
    }
  }
  bVar5 = local_d0 <= dVar19;
  free(local_b8.m_storage.m_data);
  free(local_c8.m_storage.m_data);
  free(__ptr);
  return bVar5;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validForwardSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    X diffX;
    Vec dist(M);
    Vec T = Vec::Zero(nSolFound);
    Vec sumWsq = Vec::Zero(nSolFound);
    for(int j = 0; j < M; j++)
    {
        diffX = experts[j].getPredX() - predictions[sNearest[j]];
        dist(j) = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);

        T[sNearest[j]] += dist(j);
        sumWsq(sNearest[j]) += experts[j].get_p_z()*experts[j].get_p_z();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;

    for(int k = 0; k < nSolFound; k++)
    {
        Scal dof = (sum_p_z(k) * sum_p_z(k) / sumWsq(k) - 1.0) * D;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dMax = -1.0;
        for(int j = 0; j < M; j++)
            if( (sNearest[j] == worseSol) && (dist(j) > dMax) )
            {
                dMax = dist(j);
                newSol1 = j;
            }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        Scal dist2;
        for(int j = 0; j < M; j++)
            if( sNearest[j] == worseSol )
            {
                diffX = experts[j].getPredX() - experts[newSol1].getPredX();
                dist2 = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);
                if( dist2 > dMax )
                {
                    dMax = dist2;
                    newSol2 = j;
                }
            }

        return false;
    }
}